

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O0

void test_convert<float,double>(uint length,float value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  float *__p;
  double *__p_00;
  element_type *pSrc;
  element_type *pDst;
  undefined8 *puVar4;
  uint local_27c;
  uint i;
  double *u;
  float *t;
  undefined1 local_258 [8];
  shared_ptr<double> pu;
  shared_ptr<float> pt;
  float value_local;
  uint length_local;
  __m128 a;
  uint local_1fc;
  element_type *local_1f8;
  
  __p = sse::common::malloc<float>(length);
  std::shared_ptr<float>::shared_ptr<float,void(*)(float*),void>
            ((shared_ptr<float> *)
             &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             sse::common::free<float>);
  __p_00 = sse::common::malloc<double>(length);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)local_258,__p_00,sse::common::free<double>);
  pSrc = std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)
                    &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pDst = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)local_258);
  uVar1 = CONCAT44(value,value);
  uVar2 = CONCAT44(value,value);
  local_1f8 = pSrc;
  for (local_1fc = length; 0xf < (int)local_1fc; local_1fc = local_1fc - 0x10) {
    *(undefined8 *)local_1f8 = uVar1;
    *(undefined8 *)(local_1f8 + 2) = uVar2;
    *(undefined8 *)(local_1f8 + 4) = uVar1;
    *(undefined8 *)(local_1f8 + 6) = uVar2;
    *(undefined8 *)(local_1f8 + 8) = uVar1;
    *(undefined8 *)(local_1f8 + 10) = uVar2;
    *(undefined8 *)(local_1f8 + 0xc) = uVar1;
    *(undefined8 *)(local_1f8 + 0xe) = uVar2;
    local_1f8 = local_1f8 + 0x10;
  }
  if (7 < (int)local_1fc) {
    *(undefined8 *)local_1f8 = uVar1;
    *(undefined8 *)(local_1f8 + 2) = uVar2;
    *(undefined8 *)(local_1f8 + 4) = uVar1;
    *(undefined8 *)(local_1f8 + 6) = uVar2;
    local_1fc = local_1fc - 8;
    local_1f8 = local_1f8 + 8;
  }
  if (3 < (int)local_1fc) {
    *(undefined8 *)local_1f8 = uVar1;
    *(undefined8 *)(local_1f8 + 2) = uVar2;
    local_1fc = local_1fc - 4;
    local_1f8 = local_1f8 + 4;
  }
  for (; 0 < (int)local_1fc; local_1fc = local_1fc - 1) {
    *local_1f8 = value;
    local_1f8 = local_1f8 + 1;
  }
  sse::common::convert<float,double>(pSrc,pDst,length);
  local_27c = 0;
  while( true ) {
    if (length <= local_27c) {
      std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)local_258);
      std::shared_ptr<float>::~shared_ptr
                ((shared_ptr<float> *)
                 &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    bVar3 = anon_unknown.dwarf_8d70::equal<double>(pDst[local_27c],(double)value);
    if (!bVar3) break;
    local_27c = local_27c + 1;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_convert(unsigned int, _T) [_T = float, _U = double]";
  *(undefined4 *)(puVar4 + 1) = 0x17;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}